

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O1

http_status_line * parse_status_line(http_status_line *__return_storage_ptr__,sub_string *text)

{
  sub_string other;
  sub_string other_00;
  sub_string other_01;
  bool bVar1;
  http_version hVar2;
  http_status_code hVar3;
  char *pcVar4;
  char *pcVar5;
  http_parsing_error *this;
  sub_string local_38;
  
  sub_string::sub_string(&__return_storage_ptr__->reason_phrase);
  hVar2 = parse_version(text);
  __return_storage_ptr__->version = hVar2;
  sub_string::sub_string(&local_38," ","");
  other.begin_._1_7_ = local_38.begin_._1_7_;
  other.begin_._0_1_ = local_38.begin_._0_1_;
  other.end_ = local_38.end_;
  bVar1 = sub_string::try_drop_prefix(text,other);
  if (bVar1) {
    hVar3 = parse_status_code(text);
    __return_storage_ptr__->status_code = hVar3;
    sub_string::sub_string(&local_38," ","");
    other_00.begin_._1_7_ = local_38.begin_._1_7_;
    other_00.begin_._0_1_ = local_38.begin_._0_1_;
    other_00.end_ = local_38.end_;
    bVar1 = sub_string::try_drop_prefix(text,other_00);
    if (bVar1) {
      pcVar4 = sub_string::begin(text);
      pcVar5 = sub_string::end(text);
      local_38.begin_._0_1_ = 0xd;
      pcVar4 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (pcVar4,pcVar5);
      pcVar5 = sub_string::end(text);
      if (pcVar4 == pcVar5) {
        this = (http_parsing_error *)__cxa_allocate_exception(0x10);
        http_parsing_error::http_parsing_error(this,"invalid status line");
      }
      else {
        pcVar5 = sub_string::begin(text);
        sub_string::sub_string(&local_38,pcVar5,pcVar4);
        (__return_storage_ptr__->reason_phrase).begin_ =
             (char *)CONCAT71(local_38.begin_._1_7_,local_38.begin_._0_1_);
        (__return_storage_ptr__->reason_phrase).end_ = local_38.end_;
        sub_string::begin(text,pcVar4);
        sub_string::sub_string(&local_38,"\r\n","");
        other_01.begin_._1_7_ = local_38.begin_._1_7_;
        other_01.begin_._0_1_ = local_38.begin_._0_1_;
        other_01.end_ = local_38.end_;
        bVar1 = sub_string::try_drop_prefix(text,other_01);
        if (bVar1) {
          return __return_storage_ptr__;
        }
        this = (http_parsing_error *)__cxa_allocate_exception(0x10);
        http_parsing_error::http_parsing_error(this,"invalid status line");
      }
    }
    else {
      this = (http_parsing_error *)__cxa_allocate_exception(0x10);
      http_parsing_error::http_parsing_error(this,"invalid status line");
    }
  }
  else {
    this = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(this,"invalid status line");
  }
  __cxa_throw(this,&http_parsing_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

http_status_line parse_status_line(sub_string& text)
{
    // Status-Line = HTTP-Version SP Status-Code SP Reason-Phrase CRLF
    http_status_line result;

    result.version = parse_version(text);

    if (!text.try_drop_prefix(sub_string::literal(" ")))
        throw http_parsing_error("invalid status line");

    result.status_code = parse_status_code(text);

    if (!text.try_drop_prefix(sub_string::literal(" ")))
        throw http_parsing_error("invalid status line");

    auto i = std::find(text.begin(), text.end(), '\r');
    if (i == text.end())
        throw http_parsing_error("invalid status line");

    result.reason_phrase = sub_string{text.begin(), i};

    text.begin(i);

    if (!text.try_drop_prefix(sub_string::literal("\r\n")))
        throw http_parsing_error("invalid status line");

    return result;
}